

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitSuspend(InternalAnalyzer *this,Suspend *curr)

{
  EffectAnalyzer *pEVar1;
  
  pEVar1 = this->parent;
  pEVar1->calls = true;
  if ((((pEVar1->features).features & 0x40) != 0) && (pEVar1->tryDepth == 0)) {
    pEVar1->throws_ = true;
  }
  pEVar1->implicitTrap = true;
  return;
}

Assistant:

void visitSuspend(Suspend* curr) {
      // Similar to resume/call: Suspending means that we execute arbitrary
      // other code before we may resume here.
      parent.calls = true;
      if (parent.features.hasExceptionHandling() && parent.tryDepth == 0) {
        parent.throws_ = true;
      }

      // A suspend may go unhandled and therefore trap.
      parent.implicitTrap = true;
    }